

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::parseLoopStatement(StructuralParser *this)

{
  bool bVar1;
  LoopStatement *pLVar2;
  Expression *pEVar3;
  Block *o;
  pool_ptr<soul::AST::Statement> local_58;
  pool_ptr<soul::AST::Expression> local_50;
  char *local_48;
  Context local_30;
  LoopStatement *local_18;
  LoopStatement *loopStatement;
  StructuralParser *this_local;
  
  loopStatement = (LoopStatement *)this;
  getContext(&local_30,this);
  pLVar2 = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,&local_30);
  AST::Context::~Context(&local_30);
  local_48 = "(";
  local_18 = pLVar2;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d4496);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    pEVar3 = matchCloseParen(this,pEVar3);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_50,pEVar3);
    (local_18->numIterations).object = local_50.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  }
  o = parseStatementAsNewBlock(this);
  pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Block,void>(&local_58,o);
  (local_18->body).object = local_58.object;
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_58);
  return &local_18->super_Statement;
}

Assistant:

AST::Statement& parseLoopStatement()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        if (matchIf (Operator::openParen))
            loopStatement.numIterations = matchCloseParen (parseExpression());

        loopStatement.body = parseStatementAsNewBlock();
        return loopStatement;
    }